

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O2

QDataStream * __thiscall QDataStream::operator>>(QDataStream *this,qint8 *i)

{
  qint64 qVar1;
  long in_FS_OFFSET;
  char c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  *i = '\0';
  if (this->dev != (QIODevice *)0x0) {
    c = -0x56;
    qVar1 = readBlock(this,&c,1);
    if (qVar1 == 1) {
      *i = c;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &QDataStream::operator>>(qint8 &i)
{
    i = 0;
    CHECK_STREAM_PRECOND(*this)
    char c;
    if (readBlock(&c, 1) == 1)
        i = qint8(c);
    return *this;
}